

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O0

LocaleDisplayNames *
icu_63::LocaleDisplayNames::createInstance(Locale *locale,UDisplayContext *contexts,int32_t length)

{
  LocaleDisplayNamesImpl *this;
  undefined8 local_48;
  undefined4 local_1c;
  int32_t length_local;
  UDisplayContext *contexts_local;
  Locale *locale_local;
  
  local_1c = length;
  if (contexts == (UDisplayContext *)0x0) {
    local_1c = 0;
  }
  this = (LocaleDisplayNamesImpl *)UMemory::operator_new((UMemory *)0x4b8,(size_t)contexts);
  local_48 = (LocaleDisplayNamesImpl *)0x0;
  if (this != (LocaleDisplayNamesImpl *)0x0) {
    LocaleDisplayNamesImpl::LocaleDisplayNamesImpl(this,locale,contexts,local_1c);
    local_48 = this;
  }
  return &local_48->super_LocaleDisplayNames;
}

Assistant:

LocaleDisplayNames*
LocaleDisplayNames::createInstance(const Locale& locale,
                                   UDisplayContext *contexts, int32_t length) {
    if (contexts == NULL) {
        length = 0;
    }
    return new LocaleDisplayNamesImpl(locale, contexts, length);
}